

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

DiffuseTransmissionMaterial *
pbrt::DiffuseTransmissionMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int iVar2;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DiffuseTransmissionMaterial *pDVar3;
  uintptr_t iptr;
  Float FVar4;
  allocator<char> local_89;
  string local_88;
  SpectrumTextureHandle transmittance;
  FloatTextureHandle sigma;
  SpectrumTextureHandle reflectance;
  FloatTextureHandle displacement;
  NamedTextures *local_40;
  undefined8 local_38;
  undefined4 extraout_var_03;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"reflectance",(allocator<char> *)&transmittance);
  local_38 = 0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&reflectance,(string *)parameters,
             (SpectrumHandle *)&local_88,(SpectrumType)&local_38,(Allocator)0x0);
  std::__cxx11::string::~string((string *)&local_88);
  if (((ulong)reflectance.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0x3e800000;
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8);
    *(ulong *)CONCAT44(extraout_var_00,iVar2) = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
    reflectance.
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(CONCAT44(extraout_var_00,iVar2) | 0x5000000000000);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"transmittance",(allocator<char> *)&displacement);
  local_40 = (NamedTextures *)0x0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&transmittance,(string *)parameters,
             (SpectrumHandle *)&local_88,(SpectrumType)&local_40,(Allocator)0x0);
  std::__cxx11::string::~string((string *)&local_88);
  if (((ulong)transmittance.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
    *(undefined4 *)CONCAT44(extraout_var_01,iVar1) = 0x3e800000;
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8);
    transmittance.
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(CONCAT44(extraout_var_02,iVar2) | 0x5000000000000);
    *(ulong *)CONCAT44(extraout_var_02,iVar2) = CONCAT44(extraout_var_01,iVar1) | 0x1000000000000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"displacement",(allocator<char> *)&sigma);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&displacement,(string *)parameters,
             (memory_resource *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"remaproughness",(allocator<char> *)&sigma);
  TextureParameterDictionary::GetOneBool(parameters,&local_88,true);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"sigma",&local_89);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&sigma,(string *)parameters,0.0,
             (memory_resource *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"scale",&local_89);
  FVar4 = TextureParameterDictionary::GetOneFloat(parameters,&local_88,1.0);
  std::__cxx11::string::~string((string *)&local_88);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x30,8);
  pDVar3 = (DiffuseTransmissionMaterial *)CONCAT44(extraout_var_03,iVar1);
  (pDVar3->displacement).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)
          displacement.
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  pDVar3->normalMap = normalMap;
  (pDVar3->reflectance).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)
          reflectance.
          super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  (pDVar3->transmittance).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)
          transmittance.
          super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  (pDVar3->sigma).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)
          sigma.
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  pDVar3->scale = FVar4;
  return pDVar3;
}

Assistant:

DiffuseTransmissionMaterial *DiffuseTransmissionMaterial::Create(
    const TextureParameterDictionary &parameters, Image *normalMap, const FileLoc *loc,
    Allocator alloc) {
    SpectrumTextureHandle reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Albedo, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.25f));

    SpectrumTextureHandle transmittance = parameters.GetSpectrumTexture(
        "transmittance", nullptr, SpectrumType::Albedo, alloc);
    if (!transmittance)
        transmittance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.25f));

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);
    FloatTextureHandle sigma = parameters.GetFloatTexture("sigma", 0.f, alloc);
    Float scale = parameters.GetOneFloat("scale", 1.f);

    return alloc.new_object<DiffuseTransmissionMaterial>(
        reflectance, transmittance, sigma, displacement, normalMap, scale);
}